

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,OrderedScreen *s)

{
  QPlatformScreen *pQVar1;
  QDebug *pQVar2;
  QPoint *pQVar3;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QArrayDataPointer<char16_t> QStack_68;
  QPoint local_50;
  undefined1 local_48 [8];
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_40,(QDebug *)s);
  s->screen[0x30] = (QPlatformScreen)0x0;
  pQVar2 = QDebug::operator<<((QDebug *)s,"OrderedScreen(QPlatformScreen=");
  pQVar2 = QDebug::operator<<(pQVar2,(void *)*in_RDX);
  pQVar2 = QDebug::operator<<(pQVar2," (");
  (**(code **)(*(long *)*in_RDX + 0x90))(&QStack_68);
  pQVar2 = QDebug::operator<<(pQVar2,(QString *)&QStack_68);
  pQVar2 = QDebug::operator<<(pQVar2,") : ");
  pQVar2 = QDebug::operator<<(pQVar2,*(int *)(in_RDX + 1));
  pQVar3 = (QPoint *)QDebug::operator<<(pQVar2," / ");
  local_50 = *pQVar3;
  *(int *)((long)local_50 + 0x28) = *(int *)((long)local_50 + 0x28) + 1;
  operator<<((Stream *)local_48,&local_50);
  pQVar2 = QDebug::operator<<((QDebug *)local_48," / primary: ");
  pQVar2 = QDebug::operator<<(pQVar2,*(bool *)((long)in_RDX + 0x14));
  QDebug::operator<<(pQVar2,")");
  QDebug::~QDebug((QDebug *)local_48);
  QDebug::~QDebug((QDebug *)&local_50);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
  pQVar1 = s->screen;
  s->screen = (QPlatformScreen *)0x0;
  *(QPlatformScreen **)dbg.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const OrderedScreen &s)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "OrderedScreen(QPlatformScreen=" << s.screen << " (" << s.screen->name() << ") : "
                  << s.vinfo.virtualIndex
                  << " / " << s.vinfo.virtualPos
                  << " / primary: " << s.vinfo.isPrimary
                  << ")";
    return dbg;
}